

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O2

void wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>::
     doVisitLocalSet(CoalesceLocals *self,Expression **currp)

{
  BasicBlock *pBVar1;
  _Storage<wasm::Type,_true> _Var2;
  bool bVar3;
  LocalSet *this;
  LocalGet *pLVar4;
  LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_> *this_00;
  Index *__args_1;
  optional<wasm::Type> type;
  Builder local_50;
  Block *local_48;
  Module *local_40;
  undefined8 local_38;
  Expression **local_30;
  Expression **currp_local;
  
  local_30 = currp;
  this = Expression::cast<wasm::LocalSet>(*currp);
  pBVar1 = (self->
           super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
           ).super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
           super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
           .currBasicBlock;
  if (pBVar1 == (BasicBlock *)0x0) {
    bVar3 = LocalSet::isTee(this);
    if (bVar3) {
      _Var2 = (_Storage<wasm::Type,_true>)
              (this->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id;
      local_48 = (Block *)this->value;
      if (_Var2 != (_Storage<wasm::Type,_true>)
                   (local_48->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                   type.id) {
        local_50.wasm =
             (self->
             super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
             ).
             super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
             .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
             currModule;
        local_40 = (Module *)&local_48;
        local_38 = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 1;
        type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = _Var2;
        local_48 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                             (&local_50,(initializer_list<wasm::Expression_*> *)&local_40,type);
      }
    }
    else {
      local_40 = (self->
                 super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
                 ).
                 super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .
                 super_CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>
                 .super_PostWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
                 .super_Walker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>.
                 currModule;
      local_48 = (Block *)Builder::makeDrop((Builder *)&local_40,this->value);
    }
    *currp = (Expression *)local_48;
  }
  else {
    this_00 = &(self->
               super_WalkerPass<wasm::LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>_>
               ).
               super_LivenessWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>_>
    ;
    local_40 = (Module *)CONCAT44(local_40._4_4_,1);
    __args_1 = &this->index;
    std::vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>>::
    emplace_back<wasm::LivenessAction::What,unsigned_int&,wasm::Expression**&>
              ((vector<wasm::LivenessAction,std::allocator<wasm::LivenessAction>> *)
               &(pBVar1->contents).actions,(What *)&local_40,__args_1,&local_30);
    pLVar4 = getCopy(this_00,this);
    if (pLVar4 != (LocalGet *)0x0) {
      addCopy(this_00,*__args_1,pLVar4->index);
      addCopy(this_00,*__args_1,pLVar4->index);
    }
  }
  return;
}

Assistant:

static void doVisitLocalSet(SubType* self, Expression** currp) {
    auto* curr = (*currp)->cast<LocalSet>();
    // if in unreachable code, we don't need the tee (but might need the value,
    // if it has side effects)
    if (!self->currBasicBlock) {
      if (curr->isTee()) {
        // We can remove the tee, but must leave something of the exact same
        // type.
        auto originalType = curr->type;
        if (originalType != curr->value->type) {
          *currp =
            Builder(*self->getModule()).makeBlock({curr->value}, originalType);
        } else {
          // No special handling, just use the value.
          *currp = curr->value;
        }
      } else {
        *currp = Builder(*self->getModule()).makeDrop(curr->value);
      }
      return;
    }
    self->currBasicBlock->contents.actions.emplace_back(
      LivenessAction::Set, curr->index, currp);
    // if this is a copy, note it
    if (auto* get = self->getCopy(curr)) {
      // add 2 units, so that backedge prioritization can decide ties, but not
      // much more
      self->addCopy(curr->index, get->index);
      self->addCopy(curr->index, get->index);
    }
  }